

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_bds.cpp
# Opt level: O0

void BDS::ComputeSyncAofs
               (MultiFab *aofs,int aofs_comp,int ncomp,MultiFab *state,int state_comp,MultiFab *umac
               ,MultiFab *vmac,MultiFab *wmac,MultiFab *ucorr,MultiFab *vcorr,MultiFab *wcorr,
               MultiFab *xedge,MultiFab *yedge,MultiFab *zedge,int edge_comp,bool known_edgestate,
               MultiFab *xfluxes,MultiFab *yfluxes,MultiFab *zfluxes,int fluxes_comp,MultiFab *fq,
               int fq_comp,MultiFab *divu,BCRec *d_bc,Geometry *geom,DeviceVector<int> *iconserv,
               Real dt,bool is_velocity)

{
  uint uVar1;
  Geometry geom_00;
  bool bVar2;
  long lVar3;
  int in_EDX;
  undefined8 *puVar4;
  Geometry *in_RDI;
  int *piVar5;
  byte bVar6;
  byte in_stack_00000050;
  Array4<const_double> *in_stack_00000098;
  PODVector<int,_std::allocator<int>_> *in_stack_000000a0;
  byte in_stack_000000a8;
  Array4<double> *aofs_arr;
  Real mult;
  Array4<double> divtmp_arr;
  Elixir eli;
  FArrayBox tmpfab;
  int tmpcomp;
  Box tmpbox;
  Array4<const_double> *w;
  Array4<const_double> *v;
  Array4<const_double> *u;
  Array4<const_double> *wc;
  Array4<const_double> *vc;
  Array4<const_double> *uc;
  Array4<double> *zed;
  Array4<double> *yed;
  Array4<double> *xed;
  Array4<double> *fz;
  Array4<double> *fy;
  Array4<double> *fx;
  Box *bx;
  MFIter mfi;
  int *iconserv_ptr;
  bool fluxes_are_area_weighted;
  int i;
  Array4<const_double> *in_stack_fffffffffffff388;
  MFIter *in_stack_fffffffffffff390;
  MFIter *pMVar7;
  Array4<const_double> *this;
  undefined4 uVar8;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff398;
  FabArray<amrex::FArrayBox> *b;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff3a0;
  FabArray<amrex::FArrayBox> *this_00;
  int local_c50;
  undefined1 in_stack_fffffffffffff3b7;
  uint in_stack_fffffffffffff3b8;
  undefined4 in_stack_fffffffffffff3bc;
  MFIter *in_stack_fffffffffffff3c0;
  anon_class_128_2_5a455570 *in_stack_fffffffffffff3d0;
  int in_stack_fffffffffffff3dc;
  Box *in_stack_fffffffffffff3e0;
  MFIter *in_stack_fffffffffffff3f0;
  Array4<double> *pAVar9;
  undefined1 fluxes_are_area_weighted_00;
  Array4<double> *mult_00;
  undefined1 *puVar10;
  int ncomp_00;
  Array4<const_double> *fz_00;
  Array4<const_double> *fy_00;
  Array4<const_double> *in_stack_fffffffffffff510;
  MFIter *in_stack_fffffffffffff518;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff520;
  Geometry *geom_01;
  undefined1 local_a68 [23];
  undefined1 in_stack_fffffffffffff5af;
  Real in_stack_fffffffffffff5b0;
  Array4<double> *in_stack_fffffffffffff5b8;
  Array4<double> *in_stack_fffffffffffff5c0;
  Array4<double> *in_stack_fffffffffffff5c8;
  Array4<const_double> *in_stack_fffffffffffff5d0;
  undefined1 auStack_a28 [4];
  int in_stack_fffffffffffff5dc;
  Box *in_stack_fffffffffffff5e0;
  undefined1 local_9e8 [64];
  undefined1 *local_9a8;
  Array4<const_double> local_9a0;
  Array4<const_double> local_960;
  undefined1 in_stack_fffffffffffff6ff;
  Array4<const_double> *in_stack_fffffffffffff700;
  Array4<const_double> *in_stack_fffffffffffff708;
  Array4<double> *in_stack_fffffffffffff710;
  Array4<double> *in_stack_fffffffffffff718;
  Array4<double> *in_stack_fffffffffffff720;
  Box *in_stack_fffffffffffff728;
  Array4<const_double> local_860;
  pointer local_820;
  undefined1 local_818 [56];
  Array4<const_double> *in_stack_fffffffffffff820;
  Array4<const_double> *in_stack_fffffffffffff828;
  RefID in_stack_fffffffffffff830;
  RefID in_stack_fffffffffffff838;
  Array4<const_double> *in_stack_fffffffffffff840;
  undefined1 in_stack_fffffffffffff848 [68];
  int in_stack_fffffffffffff88c;
  __uniq_ptr_impl<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
  in_stack_fffffffffffff890;
  _Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false> in_stack_fffffffffffff898;
  PCData<amrex::FArrayBox> *in_stack_fffffffffffff8a0;
  undefined4 in_stack_fffffffffffff8a8;
  undefined1 in_stack_fffffffffffff8ac [100];
  BCRec *in_stack_fffffffffffff910;
  int *in_stack_fffffffffffff918;
  Array4<const_double> *in_stack_fffffffffffff930;
  Array4<const_double> *in_stack_fffffffffffff938;
  Array4<const_double> *in_stack_fffffffffffff940;
  Array4<const_double> *in_stack_fffffffffffff948;
  Geometry *in_stack_fffffffffffff950;
  int in_stack_fffffffffffff958;
  undefined1 local_640 [192];
  FabArray<amrex::FArrayBox> *local_580;
  undefined1 local_578 [136];
  Array4<const_double> *local_4f0;
  FArrayBox *local_4e8 [8];
  FArrayBox **local_4a8;
  Array4<const_double> local_4a0;
  Array4<const_double> *local_460;
  undefined1 local_458 [64];
  undefined1 *local_418;
  Array4<double> local_410;
  Array4<double> *local_3d0;
  Array4<double> local_3c8;
  Array4<double> *local_388;
  Array4<double> local_380;
  Array4<double> *local_340;
  Array4<double> local_338;
  Array4<double> *local_2f8;
  Array4<double> local_2f0;
  Array4<double> *local_2b0;
  Array4<double> local_2a8;
  Array4<double> *local_268;
  __uniq_ptr_impl<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
  local_25c [3];
  __uniq_ptr_impl<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
  *local_240;
  MFIter local_238;
  int *local_1d8;
  byte local_1ca;
  byte local_1c9;
  byte local_1b9;
  int local_1a0;
  Geometry *local_198;
  __uniq_ptr_impl<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
  *local_188;
  undefined1 *local_180;
  int local_174;
  Array4<const_double> *local_170;
  int local_164;
  undefined1 *local_160;
  undefined4 local_158;
  int local_154;
  undefined1 *local_150;
  undefined1 *local_148;
  int local_13c;
  undefined1 *local_138;
  int local_12c;
  Dim3 local_128;
  Dim3 local_118;
  Arena *local_108;
  int local_100;
  Arena *local_f8;
  int local_f0;
  int local_ec;
  undefined1 *local_e8;
  tuple<amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  local_e0;
  Arena *local_d8;
  int local_d0;
  undefined1 *local_c8;
  undefined4 local_bc;
  undefined4 uStack_b8;
  int local_b4;
  Dim3 local_b0;
  undefined1 *local_a0;
  int local_98;
  int iStack_94;
  int local_90;
  undefined4 local_8c;
  undefined1 *local_88;
  undefined4 local_7c;
  undefined1 *local_78;
  undefined4 local_6c;
  undefined1 *local_68;
  undefined4 local_5c;
  undefined1 *local_58;
  undefined4 local_4c;
  undefined1 *local_48;
  undefined4 local_3c;
  undefined1 *local_38;
  
  bVar6 = 0;
  local_1b9 = in_stack_00000050 & 1;
  local_1c9 = in_stack_000000a8 & 1;
  local_1ca = 1;
  local_1a0 = in_EDX;
  local_198 = in_RDI;
  local_1d8 = amrex::PODVector<int,_std::allocator<int>_>::data(in_stack_000000a0);
  amrex::TilingIfNotGPU();
  amrex::MFIter::MFIter
            (in_stack_fffffffffffff3c0,
             (FabArrayBase *)CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8),
             (bool)in_stack_fffffffffffff3b7);
  geom_01 = local_198;
  while( true ) {
    bVar2 = amrex::MFIter::isValid(&local_238);
    if (!bVar2) break;
    amrex::MFIter::tilebox(in_stack_fffffffffffff3f0);
    local_240 = local_25c;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffff3a0,(MFIter *)in_stack_fffffffffffff398,
               (int)((ulong)in_stack_fffffffffffff390 >> 0x20));
    local_268 = &local_2a8;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffff3a0,(MFIter *)in_stack_fffffffffffff398,
               (int)((ulong)in_stack_fffffffffffff390 >> 0x20));
    local_2b0 = &local_2f0;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffff3a0,(MFIter *)in_stack_fffffffffffff398,
               (int)((ulong)in_stack_fffffffffffff390 >> 0x20));
    local_2f8 = &local_338;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffff3a0,(MFIter *)in_stack_fffffffffffff398,
               (int)((ulong)in_stack_fffffffffffff390 >> 0x20));
    local_340 = &local_380;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffff3a0,(MFIter *)in_stack_fffffffffffff398,
               (int)((ulong)in_stack_fffffffffffff390 >> 0x20));
    local_388 = &local_3c8;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffff3a0,(MFIter *)in_stack_fffffffffffff398,
               (int)((ulong)in_stack_fffffffffffff390 >> 0x20));
    local_3d0 = &local_410;
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffff398,in_stack_fffffffffffff390);
    local_418 = local_458;
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffff398,in_stack_fffffffffffff390);
    local_460 = &local_4a0;
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffff398,in_stack_fffffffffffff390);
    local_4a8 = local_4e8;
    pMVar7 = in_stack_fffffffffffff390;
    b = in_stack_fffffffffffff398;
    this_00 = in_stack_fffffffffffff3a0;
    if ((local_1b9 & 1) == 0) {
      in_stack_fffffffffffff510 = (Array4<const_double> *)(local_578 + 0x48);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (in_stack_fffffffffffff398,in_stack_fffffffffffff390);
      in_stack_fffffffffffff518 = (MFIter *)local_578;
      local_4f0 = in_stack_fffffffffffff510;
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (in_stack_fffffffffffff398,in_stack_fffffffffffff390);
      in_stack_fffffffffffff520 = (FabArray<amrex::FArrayBox> *)(local_640 + 0x80);
      local_578._64_8_ = in_stack_fffffffffffff518;
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (in_stack_fffffffffffff398,in_stack_fffffffffffff390);
      local_580 = in_stack_fffffffffffff520;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_fffffffffffff3a0,(MFIter *)in_stack_fffffffffffff398,
                 (int)((ulong)in_stack_fffffffffffff390 >> 0x20));
      in_stack_fffffffffffff388 = local_4f0;
      pMVar7 = (MFIter *)local_578._64_8_;
      b = local_580;
      this_00 = (FabArray<amrex::FArrayBox> *)local_640;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_fffffffffffff398,in_stack_fffffffffffff390);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_fffffffffffff3a0,(MFIter *)in_stack_fffffffffffff398,
                 (int)((ulong)in_stack_fffffffffffff390 >> 0x20));
      memcpy(&stack0xfffffffffffff8b8,in_stack_00000098,200);
      puVar4 = (undefined8 *)&stack0xfffffffffffff8b8;
      piVar5 = &local_c50;
      for (lVar3 = 0x19; lVar3 != 0; lVar3 = lVar3 + -1) {
        *(undefined8 *)piVar5 = *puVar4;
        puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
        piVar5 = piVar5 + ((ulong)bVar6 * -2 + 1) * 2;
      }
      geom_00.super_CoordSys.inv_dx[1]._4_4_ = in_stack_fffffffffffff88c;
      geom_00.super_CoordSys._0_68_ = in_stack_fffffffffffff848;
      geom_00.super_CoordSys.inv_dx[2] =
           (Real)in_stack_fffffffffffff890._M_t.
                 super__Tuple_impl<0UL,_amrex::PCData<amrex::FArrayBox>_*,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
                 .super__Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false>._M_head_impl;
      geom_00.super_CoordSys._80_8_ = in_stack_fffffffffffff898._M_head_impl;
      geom_00.prob_domain.xlo[0] = (Real)in_stack_fffffffffffff8a0;
      geom_00.prob_domain.xlo[1]._0_4_ = in_stack_fffffffffffff8a8;
      geom_00._100_100_ = in_stack_fffffffffffff8ac;
      ComputeEdgeState(in_stack_fffffffffffff5e0,in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d0
                       ,in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0,
                       in_stack_fffffffffffff5b8,in_stack_fffffffffffff820,in_stack_fffffffffffff828
                       ,(Array4<const_double> *)in_stack_fffffffffffff830.data,
                       (Array4<const_double> *)in_stack_fffffffffffff838.data,
                       in_stack_fffffffffffff840,geom_00,in_stack_fffffffffffff5b0,
                       in_stack_fffffffffffff910,in_stack_fffffffffffff918,
                       (bool)in_stack_fffffffffffff5af);
    }
    local_188 = local_240;
    in_stack_fffffffffffff890._M_t.
    super__Tuple_impl<0UL,_amrex::PCData<amrex::FArrayBox>_*,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
    .super__Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false>._M_head_impl =
         (tuple<amrex::PCData<amrex::FArrayBox>_*,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
          )(local_240->_M_t).
           super__Tuple_impl<0UL,_amrex::PCData<amrex::FArrayBox>_*,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
           .super__Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false>._M_head_impl;
    in_stack_fffffffffffff898._M_head_impl =
         (FabArray<amrex::FArrayBox> *)
         local_240[1]._M_t.
         super__Tuple_impl<0UL,_amrex::PCData<amrex::FArrayBox>_*,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
         .super__Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false>._M_head_impl;
    in_stack_fffffffffffff8a0 =
         local_240[2]._M_t.
         super__Tuple_impl<0UL,_amrex::PCData<amrex::FArrayBox>_*,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
         .super__Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false>._M_head_impl;
    uVar1 = *(uint *)&local_240[3]._M_t.
                      super__Tuple_impl<0UL,_amrex::PCData<amrex::FArrayBox>_*,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
                      .super__Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false>._M_head_impl;
    fy_00 = (Array4<const_double> *)&stack0xfffffffffffff890;
    for (local_174 = 0; local_174 < 3; local_174 = local_174 + 1) {
      local_160 = &stack0xfffffffffffff8a8;
      local_164 = local_174;
      local_13c = local_174;
      local_12c = local_174;
      if ((uVar1 & 1 << ((byte)local_174 & 0x1f)) == 0) {
        local_150 = &stack0xfffffffffffff89c;
        local_154 = local_174;
        local_158 = 1;
        *(int *)(local_150 + (long)local_174 * 4) = *(int *)(local_150 + (long)local_174 * 4) + 1;
      }
      local_138 = local_160;
    }
    local_148 = &stack0xfffffffffffff8a8;
    in_stack_fffffffffffff8a8 = 7;
    in_stack_fffffffffffff88c = local_1a0 * 3;
    local_170 = fy_00;
    amrex::FArrayBox::FArrayBox
              ((FArrayBox *)this_00,(Box *)b,(int)((ulong)pMVar7 >> 0x20),
               SUB81((ulong)pMVar7 >> 0x18,0),SUB81((ulong)pMVar7 >> 0x10,0),
               (Arena *)in_stack_fffffffffffff388);
    amrex::BaseFab<double>::elixir<double,_0>
              ((BaseFab<double> *)CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8));
    local_e0.
    super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
    .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
         in_stack_fffffffffffff848._8_8_;
    local_e8 = &stack0xfffffffffffff858;
    local_ec = in_stack_fffffffffffff848._44_4_;
    local_3c = 0;
    local_bc = in_stack_fffffffffffff848._16_4_;
    local_4c = 1;
    uStack_b8 = in_stack_fffffffffffff848._20_4_;
    local_108 = in_stack_fffffffffffff848._16_8_;
    local_5c = 2;
    local_100 = in_stack_fffffffffffff848._24_4_;
    local_68 = &stack0xfffffffffffff864;
    local_6c = 0;
    local_98 = in_stack_fffffffffffff848._28_4_ + 1;
    local_78 = &stack0xfffffffffffff864;
    local_7c = 1;
    iStack_94 = in_stack_fffffffffffff848._32_4_ + 1;
    local_88 = &stack0xfffffffffffff864;
    local_8c = 2;
    local_128.z = in_stack_fffffffffffff848._36_4_ + 1;
    local_128.y = iStack_94;
    local_128.x = local_98;
    local_180 = &stack0xfffffffffffff840;
    local_118._0_8_ = local_128._0_8_;
    local_118.z = local_128.z;
    local_f8 = local_108;
    local_f0 = local_100;
    local_d8 = local_108;
    local_d0 = local_100;
    local_c8 = local_e8;
    local_b4 = local_100;
    local_b0._0_8_ = local_128._0_8_;
    local_b0.z = local_128.z;
    local_a0 = local_e8;
    local_90 = local_128.z;
    local_58 = local_e8;
    local_48 = local_e8;
    local_38 = local_e8;
    amrex::Array4<double>::Array4
              ((Array4<double> *)local_818,
               (double *)
               local_e0.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl,
               (Dim3 *)&local_f8,&local_118,local_ec);
    local_820 = (pointer)0xbff0000000000000;
    this = &local_860;
    pAVar9 = local_2b0;
    mult_00 = local_2f8;
    puVar10 = local_418;
    fz_00 = local_460;
    amrex::Array4<const_double>::Array4<const_double,_0>(this,local_340);
    ncomp_00 = (int)((ulong)puVar10 >> 0x20);
    fluxes_are_area_weighted_00 = (undefined1)((ulong)pAVar9 >> 0x38);
    in_stack_fffffffffffff398 = (FabArray<amrex::FArrayBox> *)&stack0xfffffffffffff760;
    amrex::Array4<const_double>::Array4<const_double,_0>
              ((Array4<const_double> *)in_stack_fffffffffffff398,local_388);
    in_stack_fffffffffffff3a0 = (FabArray<amrex::FArrayBox> *)&stack0xfffffffffffff720;
    amrex::Array4<const_double>::Array4<const_double,_0>
              ((Array4<const_double> *)in_stack_fffffffffffff3a0,local_3d0);
    in_stack_fffffffffffff3b8 = local_1ca & 1;
    local_c50 = local_1a0;
    HydroUtils::ComputeFluxes
              (in_stack_fffffffffffff728,in_stack_fffffffffffff720,in_stack_fffffffffffff718,
               in_stack_fffffffffffff710,in_stack_fffffffffffff708,in_stack_fffffffffffff700,
               in_stack_fffffffffffff930,in_stack_fffffffffffff938,in_stack_fffffffffffff940,
               in_stack_fffffffffffff948,in_stack_fffffffffffff950,in_stack_fffffffffffff958,
               (bool)in_stack_fffffffffffff6ff);
    uVar8 = (undefined4)((ulong)this >> 0x20);
    amrex::Array4<const_double>::Array4<const_double,_0>
              ((Array4<const_double> *)&stack0xfffffffffffff6e0,local_268);
    amrex::Array4<const_double>::Array4<const_double,_0>(&local_960,local_2b0);
    amrex::Array4<const_double>::Array4<const_double,_0>(&local_9a0,local_2f8);
    in_stack_fffffffffffff390 = (MFIter *)(CONCAT44(uVar8,(uint)local_1ca) & 0xffffffff00000001);
    in_stack_fffffffffffff388 = in_stack_00000098;
    HydroUtils::ComputeDivergence
              ((Box *)in_stack_fffffffffffff520,(Array4<double> *)in_stack_fffffffffffff518,
               in_stack_fffffffffffff510,fy_00,fz_00,ncomp_00,geom_01,(Real)mult_00,
               (bool)fluxes_are_area_weighted_00);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffff3a0,(MFIter *)in_stack_fffffffffffff398,
               (int)((ulong)in_stack_fffffffffffff390 >> 0x20));
    local_9a8 = local_9e8;
    memcpy(local_a68,local_9a8,0x3c);
    memcpy(auStack_a28,local_818,0x3c);
    amrex::
    ParallelFor<int,BDS::ComputeSyncAofs(amrex::MultiFab&,int,int,amrex::MultiFab_const&,int,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab_const&,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,bool,amrex::MultiFab&,amrex::MultiFab&,amrex::MultiFab&,int,amrex::MultiFab_const&,int,amrex::MultiFab_const&,amrex::BCRec_const*,amrex::Geometry_const&,amrex::PODVector<int,std::allocator<int>>&,double,bool)::__0,void>
              (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d0);
    amrex::Gpu::streamSynchronize();
    amrex::Gpu::Elixir::~Elixir((Elixir *)in_stack_fffffffffffff390);
    amrex::FArrayBox::~FArrayBox((FArrayBox *)0x965ccf);
    amrex::MFIter::operator++(&local_238);
  }
  amrex::MFIter::~MFIter(in_stack_fffffffffffff390);
  return;
}

Assistant:

void
BDS::ComputeSyncAofs ( MultiFab& aofs,
                       const int aofs_comp,
                       const int ncomp,
                       MultiFab const& state,
                       const int state_comp,
                       AMREX_D_DECL( MultiFab const& umac,
                                     MultiFab const& vmac,
                                     MultiFab const& wmac),
                       AMREX_D_DECL( MultiFab const& ucorr,
                                     MultiFab const& vcorr,
                                     MultiFab const& wcorr),
                       AMREX_D_DECL( MultiFab& xedge,
                                     MultiFab& yedge,
                                     MultiFab& zedge),
                       const int  edge_comp,
                       const bool known_edgestate,
                       AMREX_D_DECL( MultiFab& xfluxes,
                                     MultiFab& yfluxes,
                                     MultiFab& zfluxes),
                       int fluxes_comp,
                       MultiFab const& fq,
                       const int fq_comp,
                       MultiFab const& divu,
                       BCRec const* d_bc,
                       Geometry const& geom,
                       Gpu::DeviceVector<int>& iconserv,
                       const Real dt,
                       const bool is_velocity)
{

    BL_PROFILE("BDS::ComputeSyncAofs()");
    amrex::ignore_unused(divu);

    bool fluxes_are_area_weighted = true;

    int const* iconserv_ptr = iconserv.data();

#if (AMREX_SPACEDIM==2)
    if ( geom.IsRZ() )
    {
        Abort("BDS does not currently support cylindrical coordinates");
    }
#endif

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(aofs,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {

        const Box& bx   = mfi.tilebox();

        //
        // Get handlers to Array4
        //
        AMREX_D_TERM( const auto& fx = xfluxes.array(mfi,fluxes_comp);,
                      const auto& fy = yfluxes.array(mfi,fluxes_comp);,
                      const auto& fz = zfluxes.array(mfi,fluxes_comp););

        AMREX_D_TERM( const auto& xed = xedge.array(mfi,edge_comp);,
                      const auto& yed = yedge.array(mfi,edge_comp);,
                      const auto& zed = zedge.array(mfi,edge_comp););

        AMREX_D_TERM( const auto& uc = ucorr.const_array(mfi);,
                      const auto& vc = vcorr.const_array(mfi);,
                      const auto& wc = wcorr.const_array(mfi););

        if ( !known_edgestate ) {

            AMREX_D_TERM( const auto& u = umac.const_array(mfi);,
                          const auto& v = vmac.const_array(mfi);,
                          const auto& w = wmac.const_array(mfi););

            BDS::ComputeEdgeState( bx, ncomp,
                                   state.array(mfi, state_comp),
                                   AMREX_D_DECL(xed,yed,zed),
                                   AMREX_D_DECL(u,v,w),
                                   divu.array(mfi),
                                   fq.array(mfi,fq_comp),
                                   geom, dt, d_bc, iconserv_ptr,
                                   is_velocity);
        }

        // Temporary divergence
        Box tmpbox = amrex::surroundingNodes(bx);
        int tmpcomp = ncomp*AMREX_SPACEDIM;
        FArrayBox tmpfab(tmpbox, tmpcomp);
        Elixir eli = tmpfab.elixir();
        Array4<Real> divtmp_arr = tmpfab.array();

        Real mult = -1.0;

        HydroUtils::ComputeFluxes( bx,
                                   AMREX_D_DECL( fx, fy, fz ),
                                   AMREX_D_DECL( uc, vc, wc ),
                                   AMREX_D_DECL( xed, yed, zed ),
                                   geom, ncomp, fluxes_are_area_weighted );

        HydroUtils::ComputeDivergence( bx, divtmp_arr,
                                       AMREX_D_DECL( fx, fy, fz ),
                                       ncomp, geom,
                                       mult, fluxes_are_area_weighted);

        // Sum contribution to sync aofs
        auto const& aofs_arr = aofs.array(mfi, aofs_comp);

        amrex::ParallelFor(bx, ncomp, [aofs_arr, divtmp_arr]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        { aofs_arr( i, j, k, n ) += - divtmp_arr( i, j, k, n ); });

        Gpu::streamSynchronize();  // otherwise we might be using too much memory
    }

}